

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O3

LLVMPointer __thiscall dg::DGLLVMPointsToSet::getKnownSingleton(DGLLVMPointsToSet *this)

{
  PointerIdPointsToSet *pPVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  byte bVar4;
  long lVar5;
  long lVar6;
  LLVMPointer LVar7;
  
  pPVar1 = (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).PTSet;
  p_Var2 = (pPVar1->pointers)._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_before_begin._M_nxt;
  if (((pPVar1->pointers)._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_element_count == 0) || (p_Var3 = p_Var2[2]._M_nxt, ((ulong)p_Var3 & 1) != 0)) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      if (lVar5 == 0x3f) {
        lVar5 = 0x40;
        break;
      }
      bVar4 = (byte)lVar5;
      lVar5 = lVar5 + 1;
    } while (((ulong)p_Var3 >> (bVar4 & 0x3f) & 2) == 0);
  }
  lVar6 = lVar5 * 0x10 + _getConstant;
  lVar5 = (long)p_Var2[1]._M_nxt * 0x10;
  LVar7.offset.offset = *(type *)(lVar5 + -8 + lVar6);
  LVar7.value = *(Value **)(*(long *)(lVar5 + -0x10 + lVar6) + 0x18);
  return LVar7;
}

Assistant:

LLVMPointer getKnownSingleton() const override {
        assert(isKnownSingleton());
        auto ptr = (*(PTSet.begin()));
        return {ptr.target->getUserData<llvm::Value>(), ptr.offset};
    }